

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5IndexGetAverages(Fts5Index *p,i64 *pnRow,i64 *anSize)

{
  byte bVar1;
  int iVar2;
  Fts5Data *pData_00;
  int local_38;
  uint local_34;
  int iCol;
  int i;
  Fts5Data *pData;
  int nCol;
  i64 *anSize_local;
  i64 *pnRow_local;
  Fts5Index *p_local;
  
  iVar2 = p->pConfig->nCol;
  *pnRow = 0;
  memset(anSize,0,(long)iVar2 << 3);
  pData_00 = fts5DataRead(p,1);
  if ((p->rc == 0) && (pData_00->nn != 0)) {
    bVar1 = sqlite3Fts5GetVarint(pData_00->p,(u64 *)pnRow);
    local_38 = 0;
    for (local_34 = (uint)bVar1; (int)local_34 < pData_00->nn && local_38 < iVar2;
        local_34 = bVar1 + local_34) {
      bVar1 = sqlite3Fts5GetVarint(pData_00->p + (int)local_34,(u64 *)(anSize + local_38));
      local_38 = local_38 + 1;
    }
  }
  fts5DataRelease(pData_00);
  iVar2 = fts5IndexReturn(p);
  return iVar2;
}

Assistant:

static int sqlite3Fts5IndexGetAverages(Fts5Index *p, i64 *pnRow, i64 *anSize){
  int nCol = p->pConfig->nCol;
  Fts5Data *pData;

  *pnRow = 0;
  memset(anSize, 0, sizeof(i64) * nCol);
  pData = fts5DataRead(p, FTS5_AVERAGES_ROWID);
  if( p->rc==SQLITE_OK && pData->nn ){
    int i = 0;
    int iCol;
    i += fts5GetVarint(&pData->p[i], (u64*)pnRow);
    for(iCol=0; i<pData->nn && iCol<nCol; iCol++){
      i += fts5GetVarint(&pData->p[i], (u64*)&anSize[iCol]);
    }
  }

  fts5DataRelease(pData);
  return fts5IndexReturn(p);
}